

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptTAC.cpp
# Opt level: O2

SourceLoc * __thiscall
MiniScript::Context::GetSourceLoc(SourceLoc *__return_storage_ptr__,Context *this)

{
  long idx;
  ListStorage<MiniScript::TACLine> *pLVar1;
  TACLine *pTVar2;
  
  idx = this->lineNum;
  if (((idx < 0) || (pLVar1 = (this->code).ls, pLVar1 == (ListStorage<MiniScript::TACLine> *)0x0))
     || ((long)(pLVar1->super_SimpleVector<MiniScript::TACLine>).mQtyItems <= idx)) {
    (__return_storage_ptr__->context).ss = (StringStorage *)0x0;
    (__return_storage_ptr__->context).isTemp = false;
    __return_storage_ptr__->lineNum = 0;
  }
  else {
    pTVar2 = List<MiniScript::TACLine>::operator[](&this->code,idx);
    SourceLoc::SourceLoc(__return_storage_ptr__,&pTVar2->location);
  }
  return __return_storage_ptr__;
}

Assistant:

SourceLoc Context::GetSourceLoc() {
		if (lineNum < 0 || lineNum >= code.Count()) {
			return SourceLoc();
		}
		return code[lineNum].location;
	}